

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  void *src;
  void *pvVar5;
  ulong srcSize;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  U32 *pUVar9;
  uint matchlengthMaxValue;
  uint maxSymbolValue;
  short offcodeNCount [32];
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_100;
  U32 *local_f8;
  ZSTD_matchState_t *local_f0;
  uint local_e8 [28];
  short local_78 [36];
  
  if (dictSize < 9 || dict == (void *)0x0) {
    return 0;
  }
  bs->rep[0] = 1;
  bs->rep[1] = 4;
  bs->rep[2] = 8;
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if (dictContentType == ZSTD_dct_rawContent) {
LAB_0010f9c4:
    ZSTD_loadDictionaryContent(ms,params,dict,dictSize,dtlm);
    uVar7 = 0;
  }
  else {
    if (*dict != -0x13cf5bc9) {
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe0;
      }
      if (dictContentType == ZSTD_dct_auto) goto LAB_0010f9c4;
    }
    local_104 = 0x1f;
    if ((params->fParams).noDictIDFlag == 0) {
      local_100 = (ulong)*(uint *)((long)dict + 4);
    }
    else {
      local_100 = 0;
    }
    local_e8[0] = 0xff;
    local_f0 = ms;
    sVar2 = HUF_readCTable((HUF_CElt *)bs,local_e8,(void *)((long)dict + 8),dictSize - 8);
    sVar3 = 0;
    if (0xfe < local_e8[0] && sVar2 < 0xffffffffffffff89) {
      sVar3 = sVar2;
    }
    uVar7 = 0xffffffffffffffe2;
    if (0xfe < local_e8[0] && sVar2 < 0xffffffffffffff89) {
      pvVar5 = (void *)(dictSize + (long)dict);
      pvVar8 = (void *)((long)dict + sVar3 + 8);
      sVar3 = FSE_readNCount(local_78,&local_104,local_e8,pvVar8,(long)pvVar5 - (long)pvVar8);
      if ((sVar3 < 0xffffffffffffff89) && (local_e8[0] < 9)) {
        sVar2 = FSE_buildCTable_wksp
                          ((bs->entropy).fse.offcodeCTable,local_78,0x1f,local_e8[0],workspace,
                           0x1800);
        pvVar8 = (void *)(sVar3 + (long)pvVar8);
        if (sVar2 < 0xffffffffffffff89) {
          local_10c = 0x34;
          sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_108,pvVar8,
                                 (long)pvVar5 - (long)pvVar8);
          if ((local_108 < 10 && sVar3 < 0xffffffffffffff89) && (0x33 < local_10c)) {
            local_f8 = bs->rep;
            lVar6 = 0;
            do {
              if (local_78[lVar6 + -0x38] == 0) {
                return 0xffffffffffffffe2;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x35);
            sVar2 = FSE_buildCTable_wksp
                              ((bs->entropy).fse.matchlengthCTable,(short *)local_e8,local_10c,
                               local_108,workspace,0x1800);
            if (sVar2 < 0xffffffffffffff89) {
              pvVar8 = (void *)((long)pvVar8 + sVar3);
              local_10c = 0x23;
              sVar3 = FSE_readNCount((short *)local_e8,&local_10c,&local_108,pvVar8,
                                     (long)pvVar5 - (long)pvVar8);
              if ((local_108 < 10 && sVar3 < 0xffffffffffffff89) && (0x22 < local_10c)) {
                lVar6 = 0;
                do {
                  if (local_78[lVar6 + -0x38] == 0) {
                    return 0xffffffffffffffe2;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 0x24);
                sVar2 = FSE_buildCTable_wksp
                                  ((bs->entropy).fse.litlengthCTable,(short *)local_e8,local_10c,
                                   local_108,workspace,0x1800);
                if ((sVar2 < 0xffffffffffffff89) &&
                   (src = (void *)((long)pvVar8 + sVar3 + 0xc), src <= pvVar5)) {
                  pUVar9 = (U32 *)((long)pvVar8 + sVar3);
                  bs->rep[0] = *pUVar9;
                  bs->rep[1] = pUVar9[1];
                  bs->rep[2] = pUVar9[2];
                  srcSize = (long)pvVar5 - (long)src;
                  uVar4 = (int)srcSize + 0x20000;
                  uVar1 = 0x1f;
                  if (uVar4 != 0) {
                    for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
                    }
                  }
                  uVar4 = 0x1f;
                  if (srcSize >> 0x11 < 0x7fff) {
                    uVar4 = uVar1;
                  }
                  if (uVar4 <= local_104) {
                    uVar7 = 0;
                    do {
                      if (local_78[uVar7] == 0) {
                        return 0xffffffffffffffe2;
                      }
                      uVar7 = uVar7 + 1;
                    } while (uVar4 + 1 != uVar7);
                    lVar6 = 0;
                    do {
                      if ((ulong)local_f8[lVar6] == 0) {
                        return 0xffffffffffffffe2;
                      }
                      if (srcSize < local_f8[lVar6]) {
                        return 0xffffffffffffffe2;
                      }
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
                    (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
                    (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
                    (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
                    ZSTD_loadDictionaryContent(local_f0,params,src,srcSize,dtlm);
                    uVar7 = local_100;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}